

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_heal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  
  iVar1 = *(int *)((long)vo + 0x158) + 100;
  if (*(short *)((long)vo + 0x15c) <= iVar1) {
    iVar1 = (int)*(short *)((long)vo + 0x15c);
  }
  *(int *)((long)vo + 0x158) = iVar1;
  update_pos((CHAR_DATA *)vo);
  send_to_char("A warm feeling fills your body.\n\r",(CHAR_DATA *)vo);
  if (ch != (CHAR_DATA *)vo) {
    send_to_char("Ok.\n\r",ch);
    return;
  }
  return;
}

Assistant:

void spell_heal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	victim->hit = std::min(victim->hit + 100, (int)victim->max_hit);

	update_pos(victim);
	send_to_char("A warm feeling fills your body.\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}